

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_rc2_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  MpiEncTestArgs *cmd;
  MPP_RET local_2c;
  MpiRc2TestCtx *pMStack_28;
  MPP_RET ret;
  MpiRc2TestCtx *ctx;
  MpiEncTestArgs *enc_cmd;
  char **argv_local;
  int argc_local;
  
  cmd = mpi_enc_test_cmd_get();
  pMStack_28 = (MpiRc2TestCtx *)0x0;
  local_2c = mpi_enc_test_cmd_update_by_args(cmd,argc,argv);
  if (local_2c == MPP_OK) {
    mpi_enc_test_cmd_show_opt(cmd);
    pMStack_28 = (MpiRc2TestCtx *)mpp_osal_calloc("main",0x2a0);
    if (pMStack_28 == (MpiRc2TestCtx *)0x0) {
      local_2c = MPP_ERR_MALLOC;
    }
    else {
      pMStack_28->enc_cmd = cmd;
      local_2c = mpi_rc_init(pMStack_28);
      if (local_2c == MPP_OK) {
        local_2c = mpi_rc_codec(pMStack_28);
        if (local_2c != MPP_OK) {
          _mpp_log_l(2,"mpi_rc_test","mpi_rc_codec failded ret %d",0,local_2c);
        }
      }
      else {
        _mpp_log_l(2,"mpi_rc_test","mpi_rc_init failded ret %d",0,local_2c);
      }
    }
  }
  if (pMStack_28 != (MpiRc2TestCtx *)0x0) {
    mpi_rc_deinit(pMStack_28);
  }
  mpi_enc_test_cmd_put(cmd);
  return local_2c;
}

Assistant:

int main(int argc, char **argv)
{
    MpiEncTestArgs* enc_cmd = mpi_enc_test_cmd_get();
    MpiRc2TestCtx *ctx = NULL;
    MPP_RET ret = MPP_OK;

    ret = mpi_enc_test_cmd_update_by_args(enc_cmd, argc, argv);
    if (ret)
        goto DONE;

    mpi_enc_test_cmd_show_opt(enc_cmd);

    ctx = mpp_calloc(MpiRc2TestCtx, 1);
    if (NULL == ctx) {
        ret = MPP_ERR_MALLOC;
        goto DONE;
    }

    ctx->enc_cmd = enc_cmd;

    ret = mpi_rc_init(ctx);
    if (ret) {
        mpp_err("mpi_rc_init failded ret %d", ret);
        goto DONE;
    }

    ret = mpi_rc_codec(ctx);
    if (ret)
        mpp_err("mpi_rc_codec failded ret %d", ret);

DONE:
    if (ctx) {
        mpi_rc_deinit(ctx);
        ctx = NULL;
    }

    mpi_enc_test_cmd_put(enc_cmd);

    return (int)ret;
}